

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O3

double __thiscall
chrono::ChVisualShapeFEA::ComputeScalarOutput
          (ChVisualShapeFEA *this,shared_ptr<chrono::fea::ChNodeFEAxyzP> *mnode,int nodeID,
          shared_ptr<chrono::fea::ChElementBase> *melement)

{
  if (this->fem_data_type == NODE_P) {
    return ((mnode->super___shared_ptr<chrono::fea::ChNodeFEAxyzP,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->P;
  }
  return 1e+30;
}

Assistant:

double ChVisualShapeFEA::ComputeScalarOutput(std::shared_ptr<ChNodeFEAxyzP> mnode,
                                             int nodeID,
                                             std::shared_ptr<ChElementBase> melement) {
    switch (fem_data_type) {
        case DataType::SURFACE:
            return 1e30;  // to force 'white' in false color scale. Hack, to be improved.
        case DataType::NODE_P:
            return (mnode->GetP());
        default:
            return 1e30;
    }
    //***TO DO*** other types of scalar outputs
    return 0;
}